

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O3

Hashtable * icu_63::LocaleUtility::getAvailableLocaleNames(UnicodeString *bundleID)

{
  UBool UVar1;
  Hashtable *pHVar2;
  Hashtable *pHVar3;
  UChar *text;
  UnicodeString *pUVar4;
  Hashtable *pHVar5;
  code *p;
  UHashtable *pUVar6;
  UErrorCode status;
  CharString cbundleID;
  UErrorCode local_bc;
  UEnumeration *local_b8;
  CharString local_b0;
  UnicodeString local_70;
  
  local_bc = U_ZERO_ERROR;
  if ((LocaleUtilityInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
     (UVar1 = umtx_initImplPreInit(&LocaleUtilityInitOnce), UVar1 == '\0')) {
    if (U_ZERO_ERROR < LocaleUtilityInitOnce.fErrCode) {
      local_bc = LocaleUtilityInitOnce.fErrCode;
    }
  }
  else {
    p = service_cleanup;
    ucln_common_registerCleanup_63(UCLN_COMMON_SERVICE,service_cleanup);
    pHVar2 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)p);
    if (pHVar2 == (Hashtable *)0x0) {
      LocaleUtility_cache = (Hashtable *)0x0;
      if (U_ZERO_ERROR < local_bc) goto LAB_0028e79c;
      local_bc = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      pHVar2->hash = (UHashtable *)0x0;
      if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar6 = &pHVar2->hashObj;
        p = uhash_hashUnicodeString_63;
        uhash_init_63(pUVar6,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                      (undefined1 *)0x0,&local_bc);
        if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
          pHVar2->hash = pUVar6;
          p = uprv_deleteUObject_63;
          uhash_setKeyDeleter_63(pUVar6,uprv_deleteUObject_63);
          pUVar6 = pHVar2->hash;
          if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
            LocaleUtility_cache = pHVar2;
            uhash_setValueDeleter_63(pUVar6,uhash_deleteHashtable_63);
            goto LAB_0028e7af;
          }
        }
        else {
          pUVar6 = pHVar2->hash;
        }
      }
      else {
        pUVar6 = (UHashtable *)0x0;
      }
      LocaleUtility_cache = pHVar2;
      if (pUVar6 != (UHashtable *)0x0) {
        uhash_close_63(pUVar6);
      }
LAB_0028e79c:
      UMemory::operator_delete((UMemory *)pHVar2,p);
      LocaleUtility_cache = (Hashtable *)0x0;
    }
LAB_0028e7af:
    LocaleUtilityInitOnce.fErrCode = local_bc;
    umtx_initImplPostInit(&LocaleUtilityInitOnce);
  }
  pHVar2 = LocaleUtility_cache;
  if (LocaleUtility_cache == (Hashtable *)0x0) {
    return (Hashtable *)0x0;
  }
  umtx_lock_63((UMutex *)0x0);
  pUVar4 = bundleID;
  pHVar3 = (Hashtable *)uhash_get_63(pHVar2->hash,bundleID);
  umtx_unlock_63((UMutex *)0x0);
  if (pHVar3 != (Hashtable *)0x0) {
    return pHVar3;
  }
  pHVar3 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
  if (pHVar3 == (Hashtable *)0x0) {
    return (Hashtable *)0x0;
  }
  pHVar3->hash = (UHashtable *)0x0;
  if (U_ZERO_ERROR < local_bc) {
    return pHVar3;
  }
  pUVar6 = &pHVar3->hashObj;
  uhash_init_63(pUVar6,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,(undefined1 *)0x0,
                &local_bc);
  if (U_ZERO_ERROR < local_bc) {
    return pHVar3;
  }
  pHVar3->hash = pUVar6;
  uhash_setKeyDeleter_63(pUVar6,uprv_deleteUObject_63);
  if (U_ZERO_ERROR < local_bc) {
    return pHVar3;
  }
  MaybeStackArray<char,_40>::MaybeStackArray(&local_b0.buffer);
  local_b0.len = 0;
  *local_b0.buffer.ptr = '\0';
  CharString::appendInvariantChars(&local_b0,bundleID,&local_bc);
  if (local_b0.len == 0) {
    local_b0.buffer.ptr = (char *)0x0;
  }
  local_b8 = ures_openAvailableLocales_63(local_b0.buffer.ptr,&local_bc);
  while( true ) {
    pUVar4 = (UnicodeString *)0x0;
    text = uenum_unext_63(local_b8,(int32_t *)0x0,&local_bc);
    if (text == (UChar *)0x0) break;
    UnicodeString::UnicodeString(&local_70,text);
    pUVar6 = pHVar3->hash;
    pUVar4 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)text);
    if (pUVar4 != (UnicodeString *)0x0) {
      UnicodeString::UnicodeString(pUVar4,&local_70);
    }
    uhash_put_63(pUVar6,pUVar4,pHVar3,&local_bc);
    UnicodeString::~UnicodeString(&local_70);
  }
  uenum_close_63(local_b8);
  if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
    umtx_lock_63((UMutex *)0x0);
    pUVar4 = bundleID;
    pHVar5 = (Hashtable *)uhash_get_63(pHVar2->hash,bundleID);
    if (pHVar5 == (Hashtable *)0x0) {
      Hashtable::put(pHVar2,bundleID,pHVar3,&local_bc);
      umtx_unlock_63((UMutex *)0x0);
      goto LAB_0028e993;
    }
    umtx_unlock_63((UMutex *)0x0);
    if (pHVar3->hash != (UHashtable *)0x0) {
      uhash_close_63(pHVar3->hash);
    }
  }
  else {
    if (pHVar3->hash != (UHashtable *)0x0) {
      uhash_close_63(pHVar3->hash);
    }
    pHVar5 = (Hashtable *)0x0;
  }
  UMemory::operator_delete((UMemory *)pHVar3,pUVar4);
  pHVar3 = pHVar5;
LAB_0028e993:
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_b0.buffer);
  return pHVar3;
}

Assistant:

const Hashtable*
LocaleUtility::getAvailableLocaleNames(const UnicodeString& bundleID)
{
    // LocaleUtility_cache is a hash-of-hashes.  The top-level keys
    // are path strings ('bundleID') passed to
    // ures_openAvailableLocales.  The top-level values are
    // second-level hashes.  The second-level keys are result strings
    // from ures_openAvailableLocales.  The second-level values are
    // garbage ((void*)1 or other random pointer).

    UErrorCode status = U_ZERO_ERROR;
    umtx_initOnce(LocaleUtilityInitOnce, locale_utility_init, status);
    Hashtable *cache = LocaleUtility_cache;
    if (cache == NULL) {
        // Catastrophic failure.
        return NULL;
    }

    Hashtable* htp;
    umtx_lock(NULL);
    htp = (Hashtable*) cache->get(bundleID);
    umtx_unlock(NULL);

    if (htp == NULL) {
        htp = new Hashtable(status);
        if (htp && U_SUCCESS(status)) {
            CharString cbundleID;
            cbundleID.appendInvariantChars(bundleID, status);
            const char* path = cbundleID.isEmpty() ? NULL : cbundleID.data();
            UEnumeration *uenum = ures_openAvailableLocales(path, &status);
            for (;;) {
                const UChar* id = uenum_unext(uenum, NULL, &status);
                if (id == NULL) {
                    break;
                }
                htp->put(UnicodeString(id), (void*)htp, status);
            }
            uenum_close(uenum);
            if (U_FAILURE(status)) {
                delete htp;
                return NULL;
            }
            umtx_lock(NULL);
            Hashtable *t = static_cast<Hashtable *>(cache->get(bundleID));
            if (t != NULL) {
                // Another thread raced through this code, creating the cache entry first.
                // Discard ours and return theirs.
                umtx_unlock(NULL);
                delete htp;
                htp = t;
            } else {
                cache->put(bundleID, (void*)htp, status);
                umtx_unlock(NULL);
            }
        }
    }
    return htp;
}